

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffpkyl(fitsfile *fptr,char *keyname,int value,char *comm,int *status)

{
  undefined2 uVar1;
  char valstring [71];
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  uVar1._0_1_ = 'F';
  uVar1._1_1_ = '\0';
  valstring[0] = 'T';
  valstring[1] = '\0';
  if (value == 0) {
    valstring._0_2_ = uVar1;
  }
  ffmkky(keyname,valstring,comm,card,status);
  ffprec(fptr,card,status);
  return *status;
}

Assistant:

int ffpkyl( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            int  value,         /* I - keyword value            */
            const char *comm,   /* I - keyword comment          */
            int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Values equal to 0 will result in a False FITS keyword; any other
  non-zero value will result in a True FITS keyword.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffl2c(value, valstring, status);   /* convert to formatted string */
    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}